

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O3

bool __thiscall
GmmLib::Table::TrackTableUsage
          (Table *this,TT_TYPE Type,bool IsL1,GMM_GFX_ADDRESS TileAdr,bool NullMapped,
          GMM_LIB_CONTEXT *pGmmLibContext)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  
  if ((int)CONCAT71(in_register_00000011,IsL1) == 0) {
    uVar2 = (uint)(TileAdr >> 0x18) & 0xfff;
  }
  else {
    uVar1 = *(ulong *)&(pGmmLibContext->WaTable).field_0x4;
    bVar4 = ((uVar1 >> 0x2f & 1) == 0) << 2 | 2;
    if ((uVar1 >> 0x2e & 1) != 0) {
      bVar4 = 0;
    }
    uVar2 = ((uint)(TileAdr >> 0xe) & 0x3ff) >> bVar4;
  }
  uVar6 = 1 << ((byte)uVar2 & 0x1f);
  if (NullMapped) {
    this->UsedEntries[uVar2 >> 5] = this->UsedEntries[uVar2 >> 5] & ~uVar6;
    lVar3 = 0x80;
    if ((IsL1) && (lVar3 = 0x20, ((pGmmLibContext->WaTable).field_0x9 & 0x40) == 0)) {
      lVar3 = 8;
    }
    lVar5 = 0;
    do {
      bVar7 = this->UsedEntries[lVar5] == 0;
      if (!bVar7) {
        return bVar7;
      }
      bVar8 = lVar3 + -1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar8);
  }
  else {
    this->UsedEntries[uVar2 >> 5] = this->UsedEntries[uVar2 >> 5] | uVar6;
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool GmmLib::Table::TrackTableUsage(TT_TYPE Type, bool IsL1, GMM_GFX_ADDRESS TileAdr, bool NullMapped, GMM_LIB_CONTEXT *pGmmLibContext )
{
    uint32_t EntryIdx;
    uint32_t ElemNum = 0, BitNum = 0;

    EntryIdx = IsL1 ? static_cast<uint32_t>(GMM_L1_ENTRY_IDX(Type, TileAdr, pGmmLibContext)) : static_cast<uint32_t>(GMM_L2_ENTRY_IDX(Type, TileAdr));

    ElemNum = EntryIdx / (sizeof(UsedEntries[0]) * 8);
    BitNum  = EntryIdx % (sizeof(UsedEntries[0]) * 8);

    if(NullMapped)
    {
        UsedEntries[ElemNum] &= ~(1 << BitNum);
    }
    else
    {
        UsedEntries[ElemNum] |= (1 << BitNum);
    }

    if(NullMapped)
    {
        int TableDWSize = IsL1 ? static_cast<int>(GMM_L1_SIZE_DWORD(Type,  pGmmLibContext)) : static_cast<int>(GMM_L2_SIZE_DWORD(Type));
        for(int i = 0; i < TableDWSize; i++)
        {
            if(UsedEntries[i])
            {
                return false;
            }
        }
    }
    return NullMapped ? true : false;
}